

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::save_ppm_file_intern(ConstPtr *image,string *filename)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  invalid_argument *piVar6;
  char *pcVar7;
  FileException *this;
  int *piVar8;
  ostream *poVar9;
  undefined4 extraout_var;
  TypedImageBase<unsigned_short> *this_00;
  element_type *this_01;
  unsigned_short *x;
  unsigned_short local_266;
  int local_264;
  undefined1 local_260 [2];
  ValueType value;
  int i;
  ConstPtr handle;
  ofstream out;
  int local_4c;
  string local_48 [4];
  int maxval;
  string magic_number;
  string *filename_local;
  ConstPtr *image_local;
  
  bVar1 = std::operator==(image,(nullptr_t)0x0);
  if (bVar1) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Null image given");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string(local_48);
  peVar5 = std::__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar3 = ImageBase::channels(peVar5);
  if (iVar3 == 1) {
    std::__cxx11::string::operator=(local_48,"P5");
  }
  else {
    peVar5 = std::
             __shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
    iVar3 = ImageBase::channels(peVar5);
    if (iVar3 != 3) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Supports 1 and 3 channel images only");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::string::operator=(local_48,"P6");
  }
  peVar5 = std::__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar3 = (*peVar5->_vptr_ImageBase[6])();
  if (iVar3 == 1) {
    local_4c = 0xff;
  }
  else {
    peVar5 = std::
             __shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
    iVar3 = (*peVar5->_vptr_ImageBase[6])();
    if (iVar3 != 2) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Invalid image format");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_4c = 0xffff;
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream
            (&handle.
              super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pcVar7,_S_bin);
  bVar2 = std::ios::good();
  if ((bVar2 & 1) == 0) {
    this = (FileException *)__cxa_allocate_exception(0x48);
    piVar8 = __errno_location();
    pcVar7 = strerror(*piVar8);
    util::FileException::FileException(this,filename,pcVar7);
    __cxa_throw(this,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  poVar9 = std::operator<<((ostream *)
                           &handle.
                            super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,local_48);
  std::operator<<(poVar9,anon_var_dwarf_4f2b6 + 10);
  peVar5 = std::__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar3 = ImageBase::width(peVar5);
  poVar9 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)
                      &handle.
                       super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,iVar3);
  poVar9 = std::operator<<(poVar9," ");
  peVar5 = std::__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar3 = ImageBase::height(peVar5);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar3);
  poVar9 = std::operator<<(poVar9," ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_4c);
  std::operator<<(poVar9,anon_var_dwarf_4f2b6 + 10);
  peVar5 = std::__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar3 = (*peVar5->_vptr_ImageBase[6])();
  if (iVar3 == 1) {
    peVar5 = std::
             __shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
    iVar3 = (*peVar5->_vptr_ImageBase[4])();
    peVar5 = std::
             __shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
    (*peVar5->_vptr_ImageBase[3])();
    std::ostream::write((char *)&handle.
                                 super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,CONCAT44(extraout_var,iVar3));
  }
  else {
    std::dynamic_pointer_cast<core::Image<unsigned_short>const,core::ImageBase_const>
              ((shared_ptr<const_core::ImageBase> *)local_260);
    local_264 = 0;
    while( true ) {
      iVar3 = local_264;
      this_00 = &std::
                 __shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_260)->super_TypedImageBase<unsigned_short>;
      iVar4 = TypedImageBase<unsigned_short>::get_value_amount(this_00);
      if (iVar4 <= iVar3) break;
      this_01 = std::
                __shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_260);
      x = Image<unsigned_short>::at(this_01,local_264);
      local_266 = util::system::betoh<unsigned_short>(x);
      std::ostream::write((char *)&handle.
                                   super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount,(long)&local_266);
      local_264 = local_264 + 1;
    }
    std::shared_ptr<const_core::Image<unsigned_short>_>::~shared_ptr
              ((shared_ptr<const_core::Image<unsigned_short>_> *)local_260);
  }
  std::ofstream::close();
  std::ofstream::~ofstream
            (&handle.
              super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void
save_ppm_file_intern (ImageBase::ConstPtr image, std::string const& filename)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    std::string magic_number;
    if (image->channels() == 1)
        magic_number = "P5";
    else if (image->channels() == 3)
        magic_number = "P6";
    else
        throw std::invalid_argument("Supports 1 and 3 channel images only");

    int maxval = 0;
    if (image->get_type() == IMAGE_TYPE_UINT8)
        maxval = 255;
    else if (image->get_type() == IMAGE_TYPE_UINT16)
        maxval = 65535;
    else
        throw std::invalid_argument("Invalid image format");

    std::ofstream out(filename.c_str(), std::ios::binary);
    if (!out.good())
        throw util::FileException(filename, std::strerror(errno));

    out << magic_number << "\n";
    out << image->width() << " " << image->height() << " " << maxval << "\n";

    if (image->get_type() == IMAGE_TYPE_UINT8)
    {
        /* Byte images can be saved as-is. */
        out.write(image->get_byte_pointer(), image->get_byte_size());
    }
    else
    {
        /* PPM is big-endian, so we need to convert 16 bit data. */
        RawImage::ConstPtr handle
            = std::dynamic_pointer_cast<RawImage const>(image);
        for (int i = 0; i < handle->get_value_amount(); ++i)
        {
            RawImage::ValueType value = util::system::betoh(handle->at(i));
            out.write((char const*)(&value), sizeof(RawImage::ValueType));
        }
    }
    out.close();
}